

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# markdownhighlighter.cpp
# Opt level: O3

void __thiscall MarkdownHighlighter::highlightCommentBlock(MarkdownHighlighter *this,QString *text)

{
  ulong uVar1;
  char cVar2;
  int iVar3;
  long lVar4;
  bool bVar5;
  QLatin1String QVar6;
  QString endText;
  QString startText;
  QArrayData *local_70 [3];
  QArrayData *local_58;
  char16_t *local_50;
  undefined8 local_48;
  QArrayData *local_40;
  char16_t *local_38;
  undefined8 local_30;
  HighlighterState local_24;
  
  QVar6.m_data = (char *)0x4;
  QVar6.m_size = (qsizetype)text;
  cVar2 = QString::startsWith(QVar6,0x14d5f8);
  if (cVar2 != '\0') {
    return;
  }
  cVar2 = QString::startsWith((QChar)(char16_t)text,9);
  if (cVar2 != '\0') {
    return;
  }
  QString::trimmed_helper((QString *)local_70);
  local_40 = (QArrayData *)0x0;
  local_38 = L"<!--";
  local_30 = 4;
  local_58 = (QArrayData *)0x0;
  local_50 = L"-->";
  local_48 = 3;
  cVar2 = QString::startsWith((QString *)local_70,(CaseSensitivity)&local_40);
  if (((cVar2 != '\0') &&
      (lVar4 = QString::indexOf((QString *)local_70,(longlong)&local_58,CaseInsensitive),
      lVar4 != -1)) ||
     ((cVar2 = QString::startsWith((QString *)local_70,(CaseSensitivity)&local_40), cVar2 == '\0' &&
      (lVar4 = QString::indexOf((QString *)local_70,(longlong)&local_40,CaseInsensitive),
      lVar4 != -1)))) goto LAB_00122e26;
  cVar2 = QString::startsWith((QString *)local_70,(CaseSensitivity)&local_40);
  bVar5 = true;
  if (cVar2 == '\0') {
    cVar2 = QString::endsWith((QString *)local_70,(CaseSensitivity)&local_58);
    if (cVar2 == '\0') {
      iVar3 = QSyntaxHighlighter::previousBlockState();
      bVar5 = iVar3 == 0xb;
    }
    else {
      bVar5 = false;
    }
  }
  cVar2 = QString::endsWith((QString *)local_70,(CaseSensitivity)&local_58);
  if (cVar2 == '\0') {
    if (!bVar5) goto LAB_00122e26;
LAB_00122dee:
    QSyntaxHighlighter::setCurrentBlockState((int)this);
  }
  else {
    iVar3 = QSyntaxHighlighter::previousBlockState();
    if (bVar5) goto LAB_00122dee;
    if (iVar3 != 0xb) goto LAB_00122e26;
  }
  uVar1 = (text->d).size;
  local_24 = Comment;
  QHash<MarkdownHighlighter::HighlighterState,_QTextCharFormat>::operator[](&_formats,&local_24);
  QSyntaxHighlighter::setFormat((int)this,0,(QTextCharFormat *)(uVar1 & 0xffffffff));
LAB_00122e26:
  if (local_58 != (QArrayData *)0x0) {
    LOCK();
    (local_58->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_58->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_58->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_58,2,8);
    }
  }
  if (local_40 != (QArrayData *)0x0) {
    LOCK();
    (local_40->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_40->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_40->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_40,2,8);
    }
  }
  if (local_70[0] != (QArrayData *)0x0) {
    LOCK();
    (local_70[0]->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_70[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_70[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_70[0],2,8);
    }
  }
  return;
}

Assistant:

void MarkdownHighlighter::highlightCommentBlock(const QString &text) {
    if (text.startsWith(QLatin1String("    ")) ||
        text.startsWith(QLatin1Char('\t')))
        return;

    const QString &trimmedText = text.trimmed();
    const QString startText(QStringLiteral("<!--"));
    const QString endText(QStringLiteral("-->"));

    // we will skip this case because that is an inline comment and causes
    // troubles here
    if (trimmedText.startsWith(startText) && trimmedText.contains(endText)) {
        return;
    }

    if (!trimmedText.startsWith(startText) && trimmedText.contains(startText))
        return;

    const bool isComment =
        trimmedText.startsWith(startText) ||
        (!trimmedText.endsWith(endText) && previousBlockState() == Comment);
    const bool isCommentEnd =
        trimmedText.endsWith(endText) && previousBlockState() == Comment;
    const bool highlight = isComment || isCommentEnd;

    if (isComment) setCurrentBlockState(Comment);
    if (highlight) setFormat(0, text.length(), _formats[Comment]);
}